

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 jx9StripTagsFromString(jx9_context *pCtx,char *zIn,int nByte,char *zTaglist,int nTaglen)

{
  byte bVar1;
  void *pvVar2;
  sxu32 sVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  undefined8 uVar7;
  ushort **ppuVar8;
  ushort *puVar9;
  byte *pbVar10;
  byte *pbVar11;
  byte *pbVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  byte *pbVar17;
  bool bVar18;
  SySet sSet;
  byte *local_78;
  int local_70;
  SySet local_68;
  long local_40;
  long local_38;
  
  local_68.pAllocator = &pCtx->pVm->sAllocator;
  local_68.nSize = 0;
  local_68.eSize = 0x10;
  local_68.nUsed = 0;
  local_68.nCursor = 0;
  local_68.pBase = (void *)0x0;
  local_68.pUserData = (void *)0x0;
  if (0 < nTaglen) {
    pbVar11 = (byte *)(zTaglist + (uint)nTaglen);
    bVar18 = true;
    do {
      while( true ) {
        bVar1 = *zTaglist;
        if (((0x3f < (ulong)bVar1) || ((0x9000a00200000000U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) &&
           ((0xbf < bVar1 ||
            (ppuVar8 = __ctype_b_loc(),
            (*(byte *)((long)*ppuVar8 + (long)(char)bVar1 * 2 + 1) & 0x20) == 0)))) break;
        zTaglist = (char *)((byte *)zTaglist + 1);
        bVar18 = zTaglist < pbVar11;
        if (!bVar18) goto LAB_0013756b;
      }
      pbVar12 = (byte *)zTaglist;
      if (!bVar18) break;
      while ((pbVar12 < pbVar11 &&
             ((bVar1 = *pbVar12, 0xffffffffffffffbf < (ulong)(long)(char)bVar1 ||
              (ppuVar8 = __ctype_b_loc(), ((*ppuVar8)[(char)bVar1] & 8) != 0))))) {
        pbVar12 = pbVar12 + 1;
      }
      if (zTaglist < pbVar12) {
        iVar16 = (int)pbVar12 - (int)zTaglist;
        local_78 = (byte *)zTaglist;
        local_70 = iVar16;
        if (iVar16 != 0) {
          do {
            bVar1 = *zTaglist;
            if ((0xffffffffffffffbf < (ulong)(long)(char)bVar1) ||
               (ppuVar8 = __ctype_b_loc(),
               (*(byte *)((long)*ppuVar8 + (long)(char)bVar1 * 2 + 1) & 0x20) == 0))
            goto LAB_001374f1;
            zTaglist = (char *)((byte *)zTaglist + 1);
            iVar16 = iVar16 + -1;
          } while (iVar16 != 0);
          iVar16 = 0;
        }
LAB_001374f1:
        local_78 = (byte *)zTaglist;
        local_70 = iVar16;
        if (iVar16 != 0) {
          do {
            uVar4 = iVar16 - 1;
            bVar1 = ((byte *)zTaglist)[uVar4];
            if ((0xffffffffffffffbf < (ulong)(long)(char)bVar1) ||
               (ppuVar8 = __ctype_b_loc(),
               (*(byte *)((long)*ppuVar8 + (long)(char)bVar1 * 2 + 1) & 0x20) == 0))
            goto LAB_00137531;
            iVar16 = iVar16 + -1;
          } while ((ulong)uVar4 != 0);
          iVar16 = 0;
        }
LAB_00137531:
        local_70 = iVar16;
        SySetPut(&local_68,&local_78);
      }
      zTaglist = (char *)(pbVar12 + 1);
      bVar18 = zTaglist < pbVar11;
    } while (bVar18);
  }
LAB_0013756b:
  uVar4 = jx9_value_string(pCtx->pRet,"",0);
  if (nByte < 1) {
LAB_001377de:
    if (((jx9_vm *)local_68.pAllocator != (jx9_vm *)0x0) && (local_68.pBase != (void *)0x0)) {
      uVar4 = SyMemBackendFree(local_68.pAllocator,local_68.pBase);
    }
    return uVar4;
  }
  pbVar12 = (byte *)(zIn + nByte);
  pbVar11 = (byte *)zIn;
LAB_00137598:
  uVar6 = 0;
  if ((*zIn != 0) && (*zIn != 0x3c)) {
    zIn = (char *)((byte *)zIn + 1);
    if (zIn < pbVar12) goto LAB_00137598;
  }
  if (pbVar11 < zIn) {
    uVar4 = jx9_value_string(pCtx->pRet,(char *)pbVar11,(int)zIn - (int)pbVar11);
    uVar6 = (ulong)uVar4;
  }
  sVar3 = local_68.nUsed;
  uVar7 = CONCAT71((int7)(uVar6 >> 8),zIn < pbVar12);
  uVar4 = (uint)uVar7;
  if (zIn < pbVar12) {
    bVar1 = *zIn;
    pbVar11 = (byte *)zIn;
    while (bVar1 == 0) {
      pbVar11 = pbVar11 + 1;
      uVar7 = CONCAT71((int7)((ulong)uVar7 >> 8),pbVar11 < pbVar12);
      uVar4 = (uint)uVar7;
      if (pbVar11 >= pbVar12) goto LAB_001377de;
      bVar1 = *pbVar11;
    }
    if ((char)uVar4 != '\0') {
      zIn = (char *)pbVar11;
      pbVar10 = pbVar11;
      if (*pbVar11 == 0x3c) {
        do {
          pbVar17 = pbVar10;
          pbVar10 = pbVar17 + 1;
          if (pbVar12 <= pbVar10) break;
        } while (*pbVar10 != 0x3e);
        zIn = (char *)(pbVar17 + 2);
        if (pbVar12 <= pbVar10) {
          zIn = (char *)pbVar10;
        }
        if (local_68.nUsed == 0) {
          uVar4 = 0;
        }
        else {
          local_40 = (long)zIn - (long)pbVar11;
          iVar16 = (int)local_40;
          pbVar10 = pbVar11;
          pbVar17 = pbVar11;
          if (0 < iVar16) {
            do {
              bVar1 = *pbVar10;
              if (((0x3f < (ulong)bVar1) ||
                  ((0x9000800000000000U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) &&
                 ((pbVar17 = pbVar10, 0xbf < bVar1 ||
                  (ppuVar8 = __ctype_b_loc(),
                  (*(byte *)((long)*ppuVar8 + (long)(char)bVar1 * 2 + 1) & 0x20) == 0)))) break;
              pbVar10 = pbVar10 + 1;
              pbVar17 = pbVar10;
            } while (pbVar10 < pbVar11 + iVar16);
          }
          while ((pbVar10 < pbVar11 + iVar16 &&
                 ((bVar1 = *pbVar10, 0xffffffffffffffbf < (ulong)(long)(char)bVar1 ||
                  (ppuVar8 = __ctype_b_loc(), ((*ppuVar8)[(char)bVar1] & 8) != 0))))) {
            pbVar10 = pbVar10 + 1;
          }
          uVar5 = (int)pbVar10 - (int)pbVar17;
          uVar4 = uVar5;
          if (uVar5 != 0) {
            puVar9 = (ushort *)(ulong)uVar5;
            lVar14 = 0;
            do {
              bVar1 = pbVar17[lVar14];
              if (0xffffffffffffffbf < (ulong)(long)(char)bVar1) {
LAB_00137738:
                pvVar2 = local_68.pBase;
                lVar13 = (ulong)(uint)((int)pbVar17 - (int)pbVar10) + lVar14;
                lVar15 = 0;
                local_38 = lVar13;
                goto LAB_00137774;
              }
              if (bVar1 != 0) {
                ppuVar8 = __ctype_b_loc();
                puVar9 = *ppuVar8;
                if ((*(byte *)((long)puVar9 + (long)(char)bVar1 * 2 + 1) & 0x20) == 0)
                goto LAB_00137738;
              }
              uVar4 = (uint)puVar9;
              lVar14 = lVar14 + 1;
            } while (uVar5 != (uint)lVar14);
          }
        }
      }
      goto LAB_001377d5;
    }
  }
  goto LAB_001377de;
  while (lVar15 = lVar15 + 0x10, (ulong)(sVar3 + (sVar3 == 0)) << 4 != lVar15) {
LAB_00137774:
    iVar16 = *(int *)((long)pvVar2 + lVar15 + 8);
    if ((int)lVar13 + iVar16 == 0) {
      uVar4 = SyStrnicmp(*(char **)((long)pvVar2 + lVar15),(char *)(pbVar17 + lVar14),
                         uVar5 - (int)lVar14);
      lVar13 = local_38;
    }
    else {
      uVar4 = iVar16 + (int)lVar13;
    }
    if (uVar4 == 0) {
      uVar4 = jx9_value_string(pCtx->pRet,(char *)pbVar11,(int)local_40);
      break;
    }
  }
LAB_001377d5:
  pbVar11 = (byte *)zIn;
  if (pbVar12 <= zIn) goto LAB_001377de;
  goto LAB_00137598;
}

Assistant:

JX9_PRIVATE sxi32 jx9StripTagsFromString(jx9_context *pCtx, const char *zIn, int nByte, const char *zTaglist, int nTaglen)
{
	const char *zEnd = &zIn[nByte];
	const char *zPtr, *zTag;
	SySet sSet;
	/* initialize the set of allowed tags */
	SySetInit(&sSet, &pCtx->pVm->sAllocator, sizeof(SyString));
	if( nTaglen > 0 ){
		/* Set of allowed tags */
		AddTag(&sSet, zTaglist, nTaglen);
	}
	/* Set the empty string */
	jx9_result_string(pCtx, "", 0);
	/* Start processing */
	for(;;){
		if(zIn >= zEnd){
			/* No more input to process */
			break;
		}
		zPtr = zIn;
		/* Find a tag */
		while( zIn < zEnd && zIn[0] != '<' && zIn[0] != 0 /* NUL byte */ ){
			zIn++;
		}
		if( zIn > zPtr ){
			/* Consume raw input */
			jx9_result_string(pCtx, zPtr, (int)(zIn-zPtr));
		}
		/* Ignore trailing null bytes */
		while( zIn < zEnd && zIn[0] == 0 ){
			zIn++;
		}
		if(zIn >= zEnd){
			/* No more input to process */
			break;
		}
		if( zIn[0] == '<' ){
			sxi32 rc;
			zTag = zIn++;
			/* Delimit the tag */
			while( zIn < zEnd && zIn[0] != '>' ){
				zIn++;
			}
			if( zIn < zEnd ){
				zIn++; /* Ignore the trailing closing tag */
			}
			/* Query the set */
			rc = FindTag(&sSet, zTag, (int)(zIn-zTag));
			if( rc == SXRET_OK ){
				/* Keep the tag */
				jx9_result_string(pCtx, zTag, (int)(zIn-zTag));
			}
		}
	}
	/* Cleanup */
	SySetRelease(&sSet);
	return SXRET_OK;
}